

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall OpenMD::PotVecAccumulator::clear(PotVecAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  (this->Avg_).data_[0] = 0.0;
  (this->Avg_).data_[1] = 0.0;
  (this->Avg_).data_[2] = 0.0;
  (this->Avg_).data_[3] = 0.0;
  (this->Avg_).data_[4] = 0.0;
  (this->Avg_).data_[5] = 0.0;
  (this->Avg_).data_[6] = 0.0;
  (this->Avg2_).data_[0] = 0.0;
  (this->Avg2_).data_[1] = 0.0;
  (this->Avg2_).data_[2] = 0.0;
  (this->Avg2_).data_[3] = 0.0;
  (this->Avg2_).data_[4] = 0.0;
  (this->Avg2_).data_[5] = 0.0;
  (this->Avg2_).data_[6] = 0.0;
  (this->Val_).data_[0] = 0.0;
  (this->Val_).data_[1] = 0.0;
  (this->Val_).data_[2] = 0.0;
  (this->Val_).data_[3] = 0.0;
  (this->Val_).data_[4] = 0.0;
  (this->Val_).data_[5] = 0.0;
  (this->Val_).data_[6] = 0.0;
  (this->Total_).data_[0] = 0.0;
  (this->Total_).data_[1] = 0.0;
  (this->Total_).data_[2] = 0.0;
  (this->Total_).data_[3] = 0.0;
  (this->Total_).data_[4] = 0.0;
  (this->Total_).data_[5] = 0.0;
  (this->Total_).data_[6] = 0.0;
  this->AvgLen_ = 0.0;
  this->AvgLen2_ = 0.0;
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      const Vector<RealType, N_INTERACTION_FAMILIES> potVecZero(0.0);
      Avg_     = potVecZero;
      Avg2_    = potVecZero;
      Val_     = potVecZero;
      Total_   = potVecZero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }